

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O0

ALboolean alIsEnabled(ALenum capability)

{
  ALboolean b;
  ALboolean retval;
  ALenum capability_local;
  
  APILOCK();
  IO_ENTRYINFO(ALEE_alIsEnabled);
  IO_ENUM(capability);
  b = (*REAL_alIsEnabled)(capability);
  IO_BOOLEAN(b);
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return b;
}

Assistant:

ALboolean alIsEnabled(ALenum capability)
{
    ALboolean retval;
    IO_START(alIsEnabled);
    IO_ENUM(capability);
    retval = REAL_alIsEnabled(capability);
    IO_BOOLEAN(retval);
    IO_END();
    return retval;
}